

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::BasicSelector>::moveAppend
          (QGenericArrayOps<QCss::BasicSelector> *this,BasicSelector *b,BasicSelector *e)

{
  BasicSelector *pBVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QString *pQVar6;
  Data *pDVar7;
  Pseudo *pPVar8;
  Data *pDVar9;
  AttributeSelector *pAVar10;
  qsizetype qVar11;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<QCss::BasicSelector>).ptr;
    qVar11 = (this->super_QArrayDataPointer<QCss::BasicSelector>).size;
    do {
      pDVar2 = (b->elementName).d.d;
      (b->elementName).d.d = (Data *)0x0;
      pBVar1[qVar11].elementName.d.d = pDVar2;
      pcVar3 = (b->elementName).d.ptr;
      (b->elementName).d.ptr = (char16_t *)0x0;
      pBVar1[qVar11].elementName.d.ptr = pcVar3;
      qVar4 = (b->elementName).d.size;
      (b->elementName).d.size = 0;
      pBVar1[qVar11].elementName.d.size = qVar4;
      pDVar5 = (b->ids).d.d;
      (b->ids).d.d = (Data *)0x0;
      pBVar1[qVar11].ids.d.d = pDVar5;
      pQVar6 = (b->ids).d.ptr;
      (b->ids).d.ptr = (QString *)0x0;
      pBVar1[qVar11].ids.d.ptr = pQVar6;
      qVar4 = (b->ids).d.size;
      (b->ids).d.size = 0;
      pBVar1[qVar11].ids.d.size = qVar4;
      pDVar7 = (b->pseudos).d.d;
      (b->pseudos).d.d = (Data *)0x0;
      pBVar1[qVar11].pseudos.d.d = pDVar7;
      pPVar8 = (b->pseudos).d.ptr;
      (b->pseudos).d.ptr = (Pseudo *)0x0;
      pBVar1[qVar11].pseudos.d.ptr = pPVar8;
      qVar4 = (b->pseudos).d.size;
      (b->pseudos).d.size = 0;
      pBVar1[qVar11].pseudos.d.size = qVar4;
      pDVar9 = (b->attributeSelectors).d.d;
      (b->attributeSelectors).d.d = (Data *)0x0;
      pBVar1[qVar11].attributeSelectors.d.d = pDVar9;
      pAVar10 = (b->attributeSelectors).d.ptr;
      (b->attributeSelectors).d.ptr = (AttributeSelector *)0x0;
      pBVar1[qVar11].attributeSelectors.d.ptr = pAVar10;
      qVar4 = (b->attributeSelectors).d.size;
      (b->attributeSelectors).d.size = 0;
      pBVar1[qVar11].attributeSelectors.d.size = qVar4;
      pBVar1[qVar11].relationToNext = b->relationToNext;
      b = b + 1;
      qVar11 = (this->super_QArrayDataPointer<QCss::BasicSelector>).size + 1;
      (this->super_QArrayDataPointer<QCss::BasicSelector>).size = qVar11;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }